

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O1

void av1_quick_txfm(int use_hadamard,TX_SIZE tx_size,BitDepthInfo bd_info,int16_t *src_diff,
                   int src_stride,tran_low_t *coeff)

{
  _func_void_int16_t_ptr_ptrdiff_t_tran_low_t_ptr **pp_Var1;
  long src_stride_00;
  TxfmParam txfm_param;
  TxfmParam local_18;
  
  if (use_hadamard == 0) {
    local_18.tx_type = '\0';
    local_18.lossless = 0;
    local_18.bd = bd_info.bit_depth;
    local_18.is_hbd = bd_info.use_highbitdepth_buf;
    local_18.tx_set_type = '\x05';
    local_18.tx_size = tx_size;
    if (local_18.bd == 8) {
      (*av1_lowbd_fwd_txfm)(src_diff,coeff,src_stride,&local_18);
    }
    else {
      av1_highbd_fwd_txfm(src_diff,coeff,src_stride,&local_18);
    }
switchD_001d11d5_default:
    return;
  }
  src_stride_00 = (long)src_stride;
  if ((ulong)bd_info >> 0x20 == 0) {
    switch(tx_size) {
    case '\0':
switchD_001d11d5_caseD_0:
      aom_hadamard_4x4_sse2(src_diff,src_stride_00,coeff);
      return;
    case '\x01':
      aom_hadamard_8x8_sse2(src_diff,src_stride_00,coeff);
      return;
    case '\x02':
      pp_Var1 = &aom_hadamard_16x16;
      break;
    case '\x03':
      pp_Var1 = &aom_hadamard_32x32;
      break;
    default:
      goto switchD_001d11d5_default;
    }
  }
  else {
    switch(tx_size) {
    case '\0':
      goto switchD_001d11d5_caseD_0;
    case '\x01':
      pp_Var1 = &aom_highbd_hadamard_8x8;
      break;
    case '\x02':
      pp_Var1 = &aom_highbd_hadamard_16x16;
      break;
    case '\x03':
      pp_Var1 = &aom_highbd_hadamard_32x32;
      break;
    default:
      goto switchD_001d11d5_default;
    }
  }
  (**pp_Var1)(src_diff,src_stride_00,coeff);
  return;
}

Assistant:

void av1_quick_txfm(int use_hadamard, TX_SIZE tx_size, BitDepthInfo bd_info,
                    const int16_t *src_diff, int src_stride,
                    tran_low_t *coeff) {
  if (use_hadamard) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (bd_info.use_highbitdepth_buf) {
      highbd_wht_fwd_txfm(tx_size, src_diff, src_stride, coeff);
    } else {
      wht_fwd_txfm(tx_size, src_diff, src_stride, coeff);
    }
#else
    wht_fwd_txfm(tx_size, src_diff, src_stride, coeff);
#endif  // CONFIG_AV1_HIGHBITDEPTH
  } else {
    TxfmParam txfm_param;
    txfm_param.tx_type = DCT_DCT;
    txfm_param.tx_size = tx_size;
    txfm_param.lossless = 0;
    txfm_param.bd = bd_info.bit_depth;
    txfm_param.is_hbd = bd_info.use_highbitdepth_buf;
    txfm_param.tx_set_type = EXT_TX_SET_ALL16;
    av1_fwd_txfm(src_diff, coeff, src_stride, &txfm_param);
  }
}